

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

bool __thiscall version_struct::operator>(version_struct *this,char *v_str)

{
  bool bVar1;
  version_struct *in_RDI;
  version_struct v_tmp;
  char *in_stack_ffffffffffffffc8;
  version_struct local_28;
  version_struct local_1c [2];
  
  version_struct(in_RDI,in_stack_ffffffffffffffc8);
  version_struct(&local_28,local_1c);
  bVar1 = operator>(in_RDI,&local_28);
  return bVar1;
}

Assistant:

bool operator>(const char* v_str)
  {
    version_struct v_tmp(v_str);
    return (*this > v_tmp);
  }